

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<int,_2>_> __thiscall
vkt::shaderexecutor::exprP<tcu::Vector<int,2>>
          (shaderexecutor *this,
          SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_> *ptr)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Vector<int,_2>_> EVar1;
  SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_> *ptr_local;
  ExprP<tcu::Vector<int,_2>_> *ret;
  
  ExprP<tcu::Vector<int,_2>_>::ExprP((ExprP<tcu::Vector<int,_2>_> *)this);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_>::operator=
            ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_> *)this,ptr);
  EVar1.super_ContainerExprPBase<tcu::Vector<int,_2>_>.super_ExprPBase<tcu::Vector<int,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_>.m_state = extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<int,_2>_>.super_ExprPBase<tcu::Vector<int,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<int,_2>_> *)this;
  return (ExprP<tcu::Vector<int,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<int,_2>_>.super_ExprPBase<tcu::Vector<int,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_>;
}

Assistant:

ExprP<T> exprP (const SharedPtr<const Expr<T> >& ptr)
{
	ExprP<T> ret;
	static_cast<SharedPtr<const Expr<T> >&>(ret) = ptr;
	return ret;
}